

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::TiledOutputFile::Data::~Data(Data *this)

{
  _Base_ptr p_Var1;
  TileBuffer *pTVar2;
  char *pcVar3;
  pointer pTVar4;
  _Rb_tree_node_base *p_Var5;
  pointer ppTVar6;
  _Link_type in_RSI;
  ulong uVar7;
  
  if (this->numXTiles != (int *)0x0) {
    operator_delete__(this->numXTiles);
  }
  if (this->numYTiles != (int *)0x0) {
    operator_delete__(this->numYTiles);
  }
  for (p_Var5 = (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->tileMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    p_Var1 = p_Var5[1]._M_left;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (*(void **)p_Var1 != (void *)0x0) {
        operator_delete__(*(void **)p_Var1);
      }
      in_RSI = (_Link_type)&DAT_00000010;
      operator_delete(p_Var1,0x10);
    }
  }
  ppTVar6 = (this->tileBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->tileBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar6) {
    uVar7 = 0;
    do {
      pTVar2 = ppTVar6[uVar7];
      if (pTVar2 != (TileBuffer *)0x0) {
        if ((long *)pTVar2->uncompressedSize != (long *)0x0) {
          (**(code **)(*(long *)pTVar2->uncompressedSize + 8))();
        }
        IlmThread_3_4::Semaphore::~Semaphore((Semaphore *)&(pTVar2->tileCoord).lx);
        if ((Compressor **)pTVar2->sampleCountTablePtr != &pTVar2->sampleCountTableCompressor) {
          operator_delete(pTVar2->sampleCountTablePtr,
                          (ulong)((long)&pTVar2->sampleCountTableCompressor->_vptr_Compressor + 1));
        }
        pcVar3 = (pTVar2->buffer)._data;
        if (pcVar3 != (char *)0x0) {
          operator_delete__(pcVar3);
        }
        in_RSI = (_Link_type)&DAT_00000088;
        operator_delete(pTVar2,0x88);
      }
      uVar7 = uVar7 + 1;
      ppTVar6 = (this->tileBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->tileBuffers).
                                   super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6 >> 3))
    ;
  }
  std::
  _Rb_tree<Imf_3_4::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
  ::_M_erase((_Rb_tree<Imf_3_4::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
              *)(this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,in_RSI);
  ppTVar6 = (this->tileBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar6 != (pointer)0x0) {
    operator_delete(ppTVar6,(long)(this->tileBuffers).
                                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar6
                   );
  }
  pTVar4 = (this->slices).
           super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar4 != (pointer)0x0) {
    operator_delete(pTVar4,(long)(this->slices).
                                 super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar4);
  }
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&(this->tileOffsets)._offsets);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

TiledOutputFile::Data::~Data ()
{
    delete[] numXTiles;
    delete[] numYTiles;

    //
    // Delete all the tile buffers, if any still happen to exist
    //

    for (TileMap::iterator i = tileMap.begin (); i != tileMap.end (); ++i)
        delete i->second;

    for (size_t i = 0; i < tileBuffers.size (); i++)
        delete tileBuffers[i];
}